

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

rcode __thiscall
olc::Platform_Linux::CreateWindowPane
          (Platform_Linux *this,vi2d *vWindowPos,vi2d *vWindowSize,bool bFullScreen)

{
  Display *pDVar1;
  XVisualInfo *pXVar2;
  Colormap CVar3;
  Window WVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  mapped_type *pmVar7;
  undefined7 in_register_00000009;
  key_type local_1a0 [4];
  Window local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  Atom wmDelete;
  GLint olc_GLAttribs [5];
  XWindowAttributes gwa;
  
  XInitThreads();
  pDVar1 = (Display *)XOpenDisplay(0);
  this->olc_Display = pDVar1;
  this->olc_WindowRoot =
       *(Window *)(*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80);
  olc_GLAttribs[0] = 4;
  olc_GLAttribs[1] = 0xc;
  olc_GLAttribs[2] = 0x18;
  olc_GLAttribs[3] = 5;
  olc_GLAttribs[4] = 0;
  pXVar2 = (XVisualInfo *)glXChooseVisual(pDVar1,0);
  this->olc_VisualInfo = pXVar2;
  CVar3 = XCreateColormap(this->olc_Display,this->olc_WindowRoot,pXVar2->visual,0);
  this->olc_ColourMap = CVar3;
  (this->olc_SetWindowAttribs).colormap = CVar3;
  (this->olc_SetWindowAttribs).event_mask = 0x22804f;
  WVar4 = XCreateWindow(this->olc_Display,this->olc_WindowRoot,vWindowPos->x,vWindowPos->y,
                        vWindowSize->x,vWindowSize->y,0,this->olc_VisualInfo->depth,1,
                        this->olc_VisualInfo->visual,0x2800,&this->olc_SetWindowAttribs);
  this->olc_Window = WVar4;
  wmDelete = XInternAtom(this->olc_Display,"WM_DELETE_WINDOW",1);
  XSetWMProtocols(this->olc_Display,this->olc_Window,&wmDelete,1);
  XMapWindow(this->olc_Display,this->olc_Window);
  XStoreName(this->olc_Display,this->olc_Window,"OneLoneCoder.com - Pixel Game Engine");
  if ((int)CONCAT71(in_register_00000009,bFullScreen) != 0) {
    uVar5 = XInternAtom(this->olc_Display,"_NET_WM_STATE",0);
    uVar6 = XInternAtom(this->olc_Display,"_NET_WM_STATE_FULLSCREEN",0);
    memset(local_1a0,0,0xc0);
    local_1a0[0] = CONCAT44(local_1a0[0]._4_4_,0x21);
    local_180 = this->olc_Window;
    local_170 = 0x20;
    local_168 = 1;
    local_158 = 0;
    uStack_150 = 0;
    local_178 = uVar5;
    local_160 = uVar6;
    XMapWindow(this->olc_Display);
    pDVar1 = this->olc_Display;
    XSendEvent(pDVar1,*(undefined8 *)
                       (*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,
               0x180000,local_1a0);
    XFlush(this->olc_Display);
    XGetWindowAttributes(this->olc_Display,this->olc_Window,&gwa);
    vWindowSize->x = gwa.width;
    vWindowSize->y = gwa.height;
  }
  local_1a0[0] = 0;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\0';
  local_1a0[0] = 0x61;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x01';
  local_1a0[0] = 0x62;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x02';
  local_1a0[0] = 99;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x03';
  local_1a0[0] = 100;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x04';
  local_1a0[0] = 0x65;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x05';
  local_1a0[0] = 0x66;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x06';
  local_1a0[0] = 0x67;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\a';
  local_1a0[0] = 0x68;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\b';
  local_1a0[0] = 0x69;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\t';
  local_1a0[0] = 0x6a;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\n';
  local_1a0[0] = 0x6b;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\v';
  local_1a0[0] = 0x6c;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\f';
  local_1a0[0] = 0x6d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\r';
  local_1a0[0] = 0x6e;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x0e';
  local_1a0[0] = 0x6f;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x0f';
  local_1a0[0] = 0x70;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x10';
  local_1a0[0] = 0x71;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x11';
  local_1a0[0] = 0x72;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x12';
  local_1a0[0] = 0x73;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x13';
  local_1a0[0] = 0x74;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x14';
  local_1a0[0] = 0x75;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x15';
  local_1a0[0] = 0x76;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x16';
  local_1a0[0] = 0x77;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x17';
  local_1a0[0] = 0x78;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x18';
  local_1a0[0] = 0x79;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x19';
  local_1a0[0] = 0x7a;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1a';
  local_1a0[0] = 0xffbe;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '%';
  local_1a0[0] = 0xffbf;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '&';
  local_1a0[0] = 0xffc0;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\'';
  local_1a0[0] = 0xffc1;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '(';
  local_1a0[0] = 0xffc2;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ')';
  local_1a0[0] = 0xffc3;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '*';
  local_1a0[0] = 0xffc4;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '+';
  local_1a0[0] = 0xffc5;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ',';
  local_1a0[0] = 0xffc6;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '-';
  local_1a0[0] = 0xffc7;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '.';
  local_1a0[0] = 0xffc8;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '/';
  local_1a0[0] = 0xffc9;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '0';
  local_1a0[0] = 0xff54;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '2';
  local_1a0[0] = 0xff51;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '3';
  local_1a0[0] = 0xff53;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '4';
  local_1a0[0] = 0xff52;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '1';
  local_1a0[0] = 0xff8d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'B';
  local_1a0[0] = 0xff0d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'B';
  local_1a0[0] = 0xff08;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '?';
  local_1a0[0] = 0xff1b;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '@';
  local_1a0[0] = 0xff0a;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'B';
  local_1a0[0] = 0xff13;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'C';
  local_1a0[0] = 0xff14;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'D';
  local_1a0[0] = 0xff09;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '6';
  local_1a0[0] = 0xffff;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ':';
  local_1a0[0] = 0xff50;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ';';
  local_1a0[0] = 0xff57;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '<';
  local_1a0[0] = 0xff55;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '=';
  local_1a0[0] = 0xff56;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '>';
  local_1a0[0] = 0xff63;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '9';
  local_1a0[0] = 0xffe1;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '7';
  local_1a0[0] = 0xffe2;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '7';
  local_1a0[0] = 0xffe3;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '8';
  local_1a0[0] = 0xffe4;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '8';
  local_1a0[0] = 0x20;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '5';
  local_1a0[0] = 0x2e;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'T';
  local_1a0[0] = 0x30;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1b';
  local_1a0[0] = 0x31;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1c';
  local_1a0[0] = 0x32;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1d';
  local_1a0[0] = 0x33;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1e';
  local_1a0[0] = 0x34;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\x1f';
  local_1a0[0] = 0x35;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ' ';
  local_1a0[0] = 0x36;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '!';
  local_1a0[0] = 0x37;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\"';
  local_1a0[0] = 0x38;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '#';
  local_1a0[0] = 0x39;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '$';
  local_1a0[0] = 0xffb0;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'E';
  local_1a0[0] = 0xffb1;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'F';
  local_1a0[0] = 0xffb2;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'G';
  local_1a0[0] = 0xffb3;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'H';
  local_1a0[0] = 0xffb4;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'I';
  local_1a0[0] = 0xffb5;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'J';
  local_1a0[0] = 0xffb6;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'K';
  local_1a0[0] = 0xffb7;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'L';
  local_1a0[0] = 0xffb8;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'M';
  local_1a0[0] = 0xffb9;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'N';
  local_1a0[0] = 0xffaa;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'O';
  local_1a0[0] = 0xffab;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'Q';
  local_1a0[0] = 0xffaf;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'P';
  local_1a0[0] = 0xffad;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'R';
  local_1a0[0] = 0xffae;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'S';
  local_1a0[0] = 0x3b;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'X';
  local_1a0[0] = 0x2f;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'Y';
  local_1a0[0] = 0x7e;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'Z';
  local_1a0[0] = 0x5b;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '[';
  local_1a0[0] = 0x5c;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '\\';
  local_1a0[0] = 0x5d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = ']';
  local_1a0[0] = 0x27;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '^';
  local_1a0[0] = 0x23;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '_';
  local_1a0[0] = 0x3d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'U';
  local_1a0[0] = 0x2c;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'V';
  local_1a0[0] = 0x2d;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = 'W';
  local_1a0[0] = 0xffe5;
  pmVar7 = std::
           map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                         *)mapKeys,local_1a0);
  *pmVar7 = '`';
  return OK;
}

Assistant:

virtual olc::rcode CreateWindowPane(const olc::vi2d &vWindowPos, olc::vi2d &vWindowSize, bool bFullScreen) override
		{
			using namespace X11;
			XInitThreads();

			// Grab the deafult display and window
			olc_Display = XOpenDisplay(NULL);
			olc_WindowRoot = DefaultRootWindow(olc_Display);

			// Based on the display capabilities, configure the appearance of the window
			GLint olc_GLAttribs[] = {GLX_RGBA, GLX_DEPTH_SIZE, 24, GLX_DOUBLEBUFFER, None};
			olc_VisualInfo = glXChooseVisual(olc_Display, 0, olc_GLAttribs);
			olc_ColourMap = XCreateColormap(olc_Display, olc_WindowRoot, olc_VisualInfo->visual, AllocNone);
			olc_SetWindowAttribs.colormap = olc_ColourMap;

			// Register which events we are interested in receiving
			olc_SetWindowAttribs.event_mask = ExposureMask | KeyPressMask | KeyReleaseMask |
											  ButtonPressMask | ButtonReleaseMask | PointerMotionMask | FocusChangeMask | StructureNotifyMask;

			// Create the window
			olc_Window = XCreateWindow(olc_Display, olc_WindowRoot, vWindowPos.x, vWindowPos.y,
									   vWindowSize.x, vWindowSize.y,
									   0, olc_VisualInfo->depth, InputOutput, olc_VisualInfo->visual,
									   CWColormap | CWEventMask, &olc_SetWindowAttribs);

			Atom wmDelete = XInternAtom(olc_Display, "WM_DELETE_WINDOW", true);
			XSetWMProtocols(olc_Display, olc_Window, &wmDelete, 1);

			XMapWindow(olc_Display, olc_Window);
			XStoreName(olc_Display, olc_Window, "OneLoneCoder.com - Pixel Game Engine");

			if (bFullScreen) // Thanks DragonEye, again :D
			{
				Atom wm_state;
				Atom fullscreen;
				wm_state = XInternAtom(olc_Display, "_NET_WM_STATE", False);
				fullscreen = XInternAtom(olc_Display, "_NET_WM_STATE_FULLSCREEN", False);
				XEvent xev{0};
				xev.type = ClientMessage;
				xev.xclient.window = olc_Window;
				xev.xclient.message_type = wm_state;
				xev.xclient.format = 32;
				xev.xclient.data.l[0] = (bFullScreen ? 1 : 0); // the action (0: off, 1: on, 2: toggle)
				xev.xclient.data.l[1] = fullscreen;			   // first property to alter
				xev.xclient.data.l[2] = 0;					   // second property to alter
				xev.xclient.data.l[3] = 0;					   // source indication
				XMapWindow(olc_Display, olc_Window);
				XSendEvent(olc_Display, DefaultRootWindow(olc_Display), False,
						   SubstructureRedirectMask | SubstructureNotifyMask, &xev);
				XFlush(olc_Display);
				XWindowAttributes gwa;
				XGetWindowAttributes(olc_Display, olc_Window, &gwa);
				vWindowSize.x = gwa.width;
				vWindowSize.y = gwa.height;
			}

			// Create Keyboard Mapping
			mapKeys[0x00] = Key::NONE;
			mapKeys[0x61] = Key::A;
			mapKeys[0x62] = Key::B;
			mapKeys[0x63] = Key::C;
			mapKeys[0x64] = Key::D;
			mapKeys[0x65] = Key::E;
			mapKeys[0x66] = Key::F;
			mapKeys[0x67] = Key::G;
			mapKeys[0x68] = Key::H;
			mapKeys[0x69] = Key::I;
			mapKeys[0x6A] = Key::J;
			mapKeys[0x6B] = Key::K;
			mapKeys[0x6C] = Key::L;
			mapKeys[0x6D] = Key::M;
			mapKeys[0x6E] = Key::N;
			mapKeys[0x6F] = Key::O;
			mapKeys[0x70] = Key::P;
			mapKeys[0x71] = Key::Q;
			mapKeys[0x72] = Key::R;
			mapKeys[0x73] = Key::S;
			mapKeys[0x74] = Key::T;
			mapKeys[0x75] = Key::U;
			mapKeys[0x76] = Key::V;
			mapKeys[0x77] = Key::W;
			mapKeys[0x78] = Key::X;
			mapKeys[0x79] = Key::Y;
			mapKeys[0x7A] = Key::Z;

			mapKeys[XK_F1] = Key::F1;
			mapKeys[XK_F2] = Key::F2;
			mapKeys[XK_F3] = Key::F3;
			mapKeys[XK_F4] = Key::F4;
			mapKeys[XK_F5] = Key::F5;
			mapKeys[XK_F6] = Key::F6;
			mapKeys[XK_F7] = Key::F7;
			mapKeys[XK_F8] = Key::F8;
			mapKeys[XK_F9] = Key::F9;
			mapKeys[XK_F10] = Key::F10;
			mapKeys[XK_F11] = Key::F11;
			mapKeys[XK_F12] = Key::F12;

			mapKeys[XK_Down] = Key::DOWN;
			mapKeys[XK_Left] = Key::LEFT;
			mapKeys[XK_Right] = Key::RIGHT;
			mapKeys[XK_Up] = Key::UP;
			mapKeys[XK_KP_Enter] = Key::ENTER;
			mapKeys[XK_Return] = Key::ENTER;

			mapKeys[XK_BackSpace] = Key::BACK;
			mapKeys[XK_Escape] = Key::ESCAPE;
			mapKeys[XK_Linefeed] = Key::ENTER;
			mapKeys[XK_Pause] = Key::PAUSE;
			mapKeys[XK_Scroll_Lock] = Key::SCROLL;
			mapKeys[XK_Tab] = Key::TAB;
			mapKeys[XK_Delete] = Key::DEL;
			mapKeys[XK_Home] = Key::HOME;
			mapKeys[XK_End] = Key::END;
			mapKeys[XK_Page_Up] = Key::PGUP;
			mapKeys[XK_Page_Down] = Key::PGDN;
			mapKeys[XK_Insert] = Key::INS;
			mapKeys[XK_Shift_L] = Key::SHIFT;
			mapKeys[XK_Shift_R] = Key::SHIFT;
			mapKeys[XK_Control_L] = Key::CTRL;
			mapKeys[XK_Control_R] = Key::CTRL;
			mapKeys[XK_space] = Key::SPACE;
			mapKeys[XK_period] = Key::PERIOD;

			mapKeys[XK_0] = Key::K0;
			mapKeys[XK_1] = Key::K1;
			mapKeys[XK_2] = Key::K2;
			mapKeys[XK_3] = Key::K3;
			mapKeys[XK_4] = Key::K4;
			mapKeys[XK_5] = Key::K5;
			mapKeys[XK_6] = Key::K6;
			mapKeys[XK_7] = Key::K7;
			mapKeys[XK_8] = Key::K8;
			mapKeys[XK_9] = Key::K9;

			mapKeys[XK_KP_0] = Key::NP0;
			mapKeys[XK_KP_1] = Key::NP1;
			mapKeys[XK_KP_2] = Key::NP2;
			mapKeys[XK_KP_3] = Key::NP3;
			mapKeys[XK_KP_4] = Key::NP4;
			mapKeys[XK_KP_5] = Key::NP5;
			mapKeys[XK_KP_6] = Key::NP6;
			mapKeys[XK_KP_7] = Key::NP7;
			mapKeys[XK_KP_8] = Key::NP8;
			mapKeys[XK_KP_9] = Key::NP9;
			mapKeys[XK_KP_Multiply] = Key::NP_MUL;
			mapKeys[XK_KP_Add] = Key::NP_ADD;
			mapKeys[XK_KP_Divide] = Key::NP_DIV;
			mapKeys[XK_KP_Subtract] = Key::NP_SUB;
			mapKeys[XK_KP_Decimal] = Key::NP_DECIMAL;

			// These keys vary depending on the keyboard. I've included comments for US and UK keyboard layouts
			mapKeys[XK_semicolon] = Key::OEM_1;	   // On US and UK keyboards this is the ';:' key
			mapKeys[XK_slash] = Key::OEM_2;		   // On US and UK keyboards this is the '/?' key
			mapKeys[XK_asciitilde] = Key::OEM_3;   // On US keyboard this is the '~' key
			mapKeys[XK_bracketleft] = Key::OEM_4;  // On US and UK keyboards this is the '[{' key
			mapKeys[XK_backslash] = Key::OEM_5;	   // On US keyboard this is '\|' key.
			mapKeys[XK_bracketright] = Key::OEM_6; // On US and UK keyboards this is the ']}' key
			mapKeys[XK_apostrophe] = Key::OEM_7;   // On US keyboard this is the single/double quote key. On UK, this is the single quote/@ symbol key
			mapKeys[XK_numbersign] = Key::OEM_8;   // miscellaneous characters. Varies by keyboard. I believe this to be the '#~' key on UK keyboards
			mapKeys[XK_equal] = Key::EQUALS;	   // the '+' key on any keyboard
			mapKeys[XK_comma] = Key::COMMA;		   // the comma key on any keyboard
			mapKeys[XK_minus] = Key::MINUS;		   // the minus key on any keyboard

			mapKeys[XK_Caps_Lock] = Key::CAPS_LOCK;

			return olc::OK;
		}